

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void runcheckpropdata(runcxdef *ctx,objnum obj,prpnum prop)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  undefined2 in_DX;
  short in_SI;
  undefined8 in_RDI;
  mcmcxdef *unaff_retaddr;
  int typ;
  prpdef *prpptr;
  objdef *objptr;
  objnum target;
  uint pofs;
  undefined6 in_stack_ffffffffffffffc8;
  mcmon in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  ushort uVar4;
  mcmon in_stack_ffffffffffffffd6;
  undefined2 uVar5;
  mcmcxdef *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_SI == -1) {
    errsigf((errcxdef *)
            CONCAT26(in_stack_ffffffffffffffd6,
                     CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
            (char *)CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8),0);
  }
  uVar2 = objgetap(unaff_retaddr,(objnum)((ulong)in_RDI >> 0x30),(prpnum)((ulong)in_RDI >> 0x20),
                   (objnum *)CONCAT26(in_SI,CONCAT24(in_DX,in_stack_fffffffffffffff0)),
                   in_stack_ffffffffffffffec);
  if (uVar2 != 0) {
    puVar3 = mcmlck(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd6);
    uVar4 = (ushort)puVar3[(ulong)uVar2 + 2];
    uVar5 = 0;
    mcmunlck((mcmcxdef *)(ulong)CONCAT14(puVar3[(ulong)uVar2 + 2],in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffce);
    iVar1 = CONCAT22(uVar5,uVar4);
    if ((iVar1 == 6) || (iVar1 == 9)) {
      errsigf((errcxdef *)CONCAT26(uVar5,CONCAT24(uVar4,iVar1)),
              (char *)CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8),0);
    }
  }
  return;
}

Assistant:

static void runcheckpropdata(runcxdef *ctx, objnum obj, prpnum prop)
{
    uint    pofs;
    objnum  target;
    objdef *objptr;
    prpdef *prpptr;
    int     typ;

    /* if the object is invalid, it's an error */
    if (obj == MCMONINV)
        errsig(ctx->runcxerr, ERR_REQVOB);
    
    /* get the property */
    pofs = objgetap(ctx->runcxmem, obj, prop, &target, FALSE);

    /* if there's no property, it's okay - it will just return nil */
    if (pofs == 0)
        return;

    /* get the object */
    objptr = mcmlck(ctx->runcxmem, target);

    /* get the property */
    prpptr = (prpdef *)(((uchar *)objptr) + pofs);
    typ = prptype(prpptr);

    /* we're done with the object's memory now */
    mcmunlck(ctx->runcxmem, target);

    /* check the type */
    switch(typ)
    {
    case DAT_CODE:
    case DAT_DSTRING:
        /* 
         *   we can't call code or evaluate (i.e., print) double-quoted
         *   strings during speculative evaluation 
         */
        errsig(ctx->runcxerr, ERR_RTBADSPECEXPR);

    default:
        /* other types do not involve method calls, so they're okay */
        break;
    }
}